

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDTree.hpp
# Opt level: O0

bool __thiscall
kdtree::
KDTree<int,_5U,_kdtree::default_new<int,_5>,_kdtree::default_delete<int>,_kdtree::default_set<int>,_kdtree::default_less<int>_>
::nodeInSearchRange(KDTree<int,_5U,_kdtree::default_new<int,_5>,_kdtree::default_delete<int>,_kdtree::default_set<int>,_kdtree::default_less<int>_>
                    *this,int *searchMin,int *searchMax,Node *node)

{
  bool bVar1;
  bool local_37;
  default_less<int> local_36;
  default_less<int> local_35;
  uint local_34;
  Node *pNStack_30;
  int d;
  Node *node_local;
  int *searchMax_local;
  int *searchMin_local;
  KDTree<int,_5U,_kdtree::default_new<int,_5>,_kdtree::default_delete<int>,_kdtree::default_set<int>,_kdtree::default_less<int>_>
  *this_local;
  
  local_34 = 0;
  pNStack_30 = node;
  node_local = (Node *)searchMax;
  searchMax_local = searchMin;
  searchMin_local = (int *)this;
  while( true ) {
    if (4 < local_34) {
      return true;
    }
    bVar1 = default_less<int>::operator()(&local_35,pNStack_30->value,searchMax_local,local_34);
    local_37 = true;
    if (!bVar1) {
      local_37 = default_less<int>::operator()
                           (&local_36,(int *)node_local,pNStack_30->value,local_34);
    }
    if (local_37 != false) break;
    local_34 = local_34 + 1;
  }
  return false;
}

Assistant:

bool nodeInSearchRange(const T * const searchMin, const T * const searchMax, Node * const node) const {
			for (int d = 0; d < dim; d++) {
				if (LESS()(node->value, searchMin, d)
					|| LESS()(searchMax, node->value, d)) {
					return false;
				}
			}
			return true;
		}